

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O1

void addtest(void *elem)

{
  int iVar1;
  void *realret;
  ulong uVar2;
  
  uVar2 = 0;
  if (tree->cmp == (cmpfn234)0x0) {
    realret = (void *)0x0;
  }
  else {
    realret = add234_internal(tree,elem,-1);
  }
  if (0 < arraylen) {
    uVar2 = 0;
    do {
      iVar1 = (*cmp)(elem,array[uVar2]);
      if (iVar1 < 1) break;
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)arraylen);
  }
  if ((int)uVar2 < arraylen) {
    iVar1 = (*cmp)(elem,array[uVar2 & 0xffffffff]);
    if (iVar1 == 0) {
      if (realret != array[uVar2 & 0xffffffff]) {
        error("add: retval was %p expected %p",realret);
        return;
      }
      return;
    }
  }
  internal_addtest(elem,(int)uVar2,realret);
  return;
}

Assistant:

void addtest(void *elem)
{
    int i;
    void *realret;

    realret = add234(tree, elem);

    i = 0;
    while (i < arraylen && cmp(elem, array[i]) > 0)
        i++;
    if (i < arraylen && !cmp(elem, array[i])) {
        void *retval = array[i];       /* expect that returned not elem */
        if (realret != retval) {
            error("add: retval was %p expected %p", realret, retval);
        }
    } else
        internal_addtest(elem, i, realret);
}